

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O0

int __thiscall ncnn::Scale::forward_inplace(Scale *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined8 in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_top_blobs;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Mat *in_stack_ffffffffffffff98;
  Mat *this_00;
  allocator_type *in_stack_ffffffffffffffa0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_01;
  undefined1 local_31 [25];
  undefined8 local_18;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_10;
  
  this_01 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_31;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x500c7c);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (this_01,(size_type)in_RDI,in_stack_ffffffffffffffa0);
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x500c9c);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(local_31 + 1),0);
  ncnn::Mat::operator=
            (in_stack_ffffffffffffff98,
             (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  this_00 = (Mat *)(in_RDI + 0x1b);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(local_31 + 1),1);
  ncnn::Mat::operator=(this_00,(Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
  ;
  iVar1 = (**(code **)(*in_RDI + 0x40))(in_RDI,local_31 + 1,local_18);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(local_10);
  return iVar1;
}

Assistant:

int Scale::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    std::vector<Mat> bottom_top_blobs(2);
    bottom_top_blobs[0] = bottom_top_blob;
    bottom_top_blobs[1] = scale_data;

    return forward_inplace(bottom_top_blobs, opt);
}